

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GeluLayerParams::SerializeWithCachedSizes
          (GeluLayerParams *this,CodedOutputStream *output)

{
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->mode_,output);
    return;
  }
  return;
}

Assistant:

void GeluLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.GeluLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.GeluLayerParams.GeluMode mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.GeluLayerParams)
}